

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O2

void Cec_ManPrintFlopEquivs(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pObj_00;
  void *pvVar3;
  void *pvVar4;
  Vec_Ptr_t *pVVar5;
  Gia_Man_t *pGVar6;
  int iVar7;
  
  if (p->vNamesIn == (Vec_Ptr_t *)0x0) {
    __assert_fail("p->vNamesIn != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                  ,0x45d,"void Cec_ManPrintFlopEquivs(Gia_Man_t *)");
  }
  iVar7 = 0;
  while( true ) {
    if (p->nRegs <= iVar7) {
      return;
    }
    pObj = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar7);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjId(p,pObj);
    if (((uint)p->pReprs[iVar1] & 0xfffffff) == 0) {
      pVVar5 = p->vNamesIn;
      iVar1 = Gia_ObjCioId(pObj);
      pvVar3 = Vec_PtrEntry(pVVar5,iVar1);
      Abc_Print((int)pVVar5,"Original flop %s is proved equivalent to constant.\n",pvVar3);
    }
    else {
      iVar1 = Gia_ObjId(p,pObj);
      pObj_00 = Gia_ObjReprObj(p,iVar1);
      if (pObj_00 != (Gia_Obj_t *)0x0) {
        uVar2 = *(uint *)pObj_00;
        pVVar5 = p->vNamesIn;
        iVar1 = Gia_ObjCioId(pObj);
        pvVar3 = Vec_PtrEntry(pVVar5,iVar1);
        if ((~uVar2 & 0x9fffffff) == 0) {
          pVVar5 = p->vNamesIn;
          iVar1 = Gia_ObjCioId(pObj_00);
          pvVar4 = Vec_PtrEntry(pVVar5,iVar1);
          Abc_Print((int)pVVar5,"Original flop %s is proved equivalent to flop %s.\n",pvVar3,pvVar4)
          ;
        }
        else {
          pGVar6 = p;
          uVar2 = Gia_ObjId(p,pObj_00);
          Abc_Print((int)pGVar6,"Original flop %s is proved equivalent to internal node %d.\n",
                    pvVar3,(ulong)uVar2);
        }
      }
    }
    iVar7 = iVar7 + 1;
  }
  return;
}

Assistant:

void Cec_ManPrintFlopEquivs( Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pRepr;
    int i;
    assert( p->vNamesIn != NULL );
    Gia_ManForEachRo( p, pObj, i )
    {
        if ( Gia_ObjIsConst(p, Gia_ObjId(p, pObj)) )
            Abc_Print( 1, "Original flop %s is proved equivalent to constant.\n", Vec_PtrEntry(p->vNamesIn, Gia_ObjCioId(pObj)) );
        else if ( (pRepr = Gia_ObjReprObj(p, Gia_ObjId(p, pObj))) )
        {
            if ( Gia_ObjIsCi(pRepr) )
                Abc_Print( 1, "Original flop %s is proved equivalent to flop %s.\n",
                    Vec_PtrEntry( p->vNamesIn, Gia_ObjCioId(pObj)  ),
                    Vec_PtrEntry( p->vNamesIn, Gia_ObjCioId(pRepr) ) );
            else
                Abc_Print( 1, "Original flop %s is proved equivalent to internal node %d.\n",
                    Vec_PtrEntry( p->vNamesIn, Gia_ObjCioId(pObj) ), Gia_ObjId(p, pRepr) );
        }
    }
}